

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O0

uint32_t __thiscall spirv_cross::CFG::find_common_dominator(CFG *this,uint32_t a,uint32_t b)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined4 local_18;
  undefined4 local_14;
  uint32_t b_local;
  uint32_t a_local;
  CFG *this_local;
  
  local_18 = b;
  local_14 = a;
  while (local_14 != local_18) {
    uVar1 = get_visit_order(this,local_14);
    uVar2 = get_visit_order(this,local_18);
    if (uVar1 < uVar2) {
      local_14 = get_immediate_dominator(this,local_14);
    }
    else {
      local_18 = get_immediate_dominator(this,local_18);
    }
  }
  return local_14;
}

Assistant:

uint32_t CFG::find_common_dominator(uint32_t a, uint32_t b) const
{
	while (a != b)
	{
		if (get_visit_order(a) < get_visit_order(b))
			a = get_immediate_dominator(a);
		else
			b = get_immediate_dominator(b);
	}
	return a;
}